

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  _GLFWwindow *window;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  else if (attrib == 0x20001) {
    handle_local._4_4_ = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
  }
  else if (attrib == 0x20002) {
    handle_local._4_4_ = _glfwPlatformWindowIconified((_GLFWwindow *)handle);
  }
  else if (attrib == 0x20003) {
    handle_local._4_4_ = (uint)(byte)handle[8];
  }
  else if (attrib == 0x20004) {
    handle_local._4_4_ = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
  }
  else if (attrib == 0x20005) {
    handle_local._4_4_ = (uint)(byte)handle[9];
  }
  else if (attrib == 0x20007) {
    handle_local._4_4_ = (uint)(byte)handle[0xb];
  }
  else if (attrib == 0x22001) {
    handle_local._4_4_ = *(uint *)(handle + 0x1c4);
  }
  else if (attrib == 0x22002) {
    handle_local._4_4_ = *(uint *)(handle + 0x1c8);
  }
  else if (attrib == 0x22003) {
    handle_local._4_4_ = *(uint *)(handle + 0x1cc);
  }
  else if (attrib == 0x22004) {
    handle_local._4_4_ = *(uint *)(handle + 0x1d0);
  }
  else if (attrib == 0x22005) {
    handle_local._4_4_ = *(uint *)(handle + 0x1dc);
  }
  else if (attrib == 0x22006) {
    handle_local._4_4_ = (uint)(byte)handle[0x1d4];
  }
  else if (attrib == 0x22007) {
    handle_local._4_4_ = (uint)(byte)handle[0x1d5];
  }
  else if (attrib == 0x22008) {
    handle_local._4_4_ = *(uint *)(handle + 0x1d8);
  }
  else if (attrib == 0x22009) {
    handle_local._4_4_ = *(uint *)(handle + 0x1e0);
  }
  else {
    _glfwInputError(0x10003,"Invalid window attribute");
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfwPlatformWindowFocused(window);
        case GLFW_ICONIFIED:
            return _glfwPlatformWindowIconified(window);
        case GLFW_VISIBLE:
            return _glfwPlatformWindowVisible(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_CLIENT_API:
            return window->context.api;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute");
    return 0;
}